

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O3

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateValue
          (HtmlparserCppTest *this,string *expected_value)

{
  HtmlParser *source;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  HtmlparserCppTest *pHVar6;
  HtmlparserCppTest *pHVar7;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  int *piVar8;
  HtmlParser *this_00;
  const_iterator cVar9;
  mapped_type *ppHVar10;
  undefined8 extraout_RAX_02;
  undefined7 uVar12;
  HtmlparserCppTest *pHVar11;
  ulong uVar13;
  htmlparser_ctx *phVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  HtmlparserCppTest *pHVar17;
  HtmlparserCppTest *pHVar18;
  htmlparser_ctx_s *phVar19;
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  pointer this_01;
  _Base_ptr unaff_R12;
  pointer str_00;
  _Base_ptr unaff_R15;
  string parsed_state;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_1e0;
  HtmlparserCppTest *pHStack_1c8;
  _Base_ptr p_Stack_1c0;
  undefined1 auStack_180 [16];
  _Base_ptr p_Stack_170;
  HtmlparserCppTest *pHStack_168;
  _Base_ptr p_Stack_160;
  undefined1 auStack_158 [16];
  _Base_ptr p_Stack_148;
  HtmlparserCppTest *pHStack_140;
  _Base_ptr p_Stack_138;
  char *pcStack_130;
  HtmlParser HStack_128;
  allocator aStack_e9;
  HtmlparserCppTest *pHStack_e8;
  size_t sStack_e0;
  HtmlparserCppTest HStack_d8;
  HtmlparserCppTest *pHStack_98;
  ulong uStack_90;
  HtmlparserCppTest *pHStack_80;
  allocator aStack_69;
  HtmlparserCppTest *pHStack_68;
  size_t sStack_60;
  undefined1 auStack_58 [40];
  HtmlparserCppTest *local_30;
  HtmlParser local_28;
  
  pHVar11 = (HtmlparserCppTest *)(this->parser_).parser_;
  auStack_58._24_8_ = (_Base_ptr)0x10706c;
  pHVar6 = (HtmlparserCppTest *)expected_value;
  lVar5 = ctemplate_htmlparser::htmlparser_value((htmlparser_ctx_s *)pHVar11);
  if (lVar5 != 0) {
    auStack_58._24_8_ = (_Base_ptr)0x10707a;
    pHVar6 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_value((this->parser_).parser_);
    auStack_58._24_8_ = (_Base_ptr)0x10708f;
    pHVar11 = (HtmlparserCppTest *)&local_30;
    std::__cxx11::string::string
              ((string *)&local_30,(char *)pHVar6,(allocator *)(auStack_58 + 0x27));
    phVar14 = (htmlparser_ctx *)expected_value->_M_string_length;
    this = (HtmlparserCppTest *)&local_30;
    if (phVar14 == local_28.parser_) {
      if (phVar14 == (htmlparser_ctx *)0x0) {
LAB_001070b2:
        if (local_30 != (HtmlparserCppTest *)&stack0xffffffffffffffe0) {
          auStack_58._24_8_ = (_Base_ptr)0x1070c4;
          operator_delete(local_30);
        }
        return;
      }
      pHVar11 = (HtmlparserCppTest *)(expected_value->_M_dataplus)._M_p;
      auStack_58._24_8_ = (_Base_ptr)0x1070ae;
      pHVar6 = local_30;
      iVar4 = bcmp(pHVar11,local_30,(size_t)phVar14);
      this = local_30;
      if (iVar4 == 0) goto LAB_001070b2;
    }
    auStack_58._24_8_ = (_Base_ptr)0x1070d1;
    ValidateValue();
  }
  auStack_58._24_8_ = ValidateAttributeType;
  ValidateValue();
  auStack_58._24_8_ = this;
  auStack_58._16_8_ = expected_value;
  pHVar11 = (HtmlparserCppTest *)(pHVar11->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar11);
  puVar15 = kAttributeTypeMap;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar11,(IdNameMap *)kAttributeTypeMap,iVar4);
  if (*(long *)&(pHVar6->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
    ValidateAttributeType();
  }
  else {
    pHVar11 = (HtmlparserCppTest *)&pHStack_68;
    std::__cxx11::string::string((string *)pHVar11,(char *)pHVar7,&aStack_69);
    sVar2 = *(size_t *)&(pHVar6->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    puVar15 = (undefined1 *)pHVar7;
    if (sVar2 == sStack_60) {
      uVar12 = (undefined7)((ulong)pHVar6 >> 8);
      if (sVar2 == 0) {
        pHVar6 = (HtmlparserCppTest *)CONCAT71(uVar12,1);
      }
      else {
        pHVar11 = *(HtmlparserCppTest **)&(pHVar6->contextMap)._M_t._M_impl;
        puVar15 = (undefined1 *)pHStack_68;
        iVar4 = bcmp(pHVar11,pHStack_68,sVar2);
        pHVar6 = (HtmlparserCppTest *)CONCAT71(uVar12,iVar4 == 0);
      }
    }
    else {
      pHVar6 = (HtmlparserCppTest *)0x0;
    }
    if (pHStack_68 != (HtmlparserCppTest *)auStack_58) {
      pHVar11 = pHStack_68;
      operator_delete(pHStack_68);
    }
    this = pHStack_68;
    if ((char)pHVar6 != '\0') {
      return;
    }
  }
  ValidateAttributeType();
  uStack_90 = 0x10717a;
  pHStack_80 = pHVar6;
  bVar3 = StringToBool((string *)puVar15);
  uVar13 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  phVar19 = (pHVar11->parser_).parser_;
  uStack_90 = 0x107185;
  iVar4 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar19);
  if (SUB81(uVar13,0) == (iVar4 != 0)) {
    return;
  }
  uStack_90 = 0x10719b;
  ValidateAttributeQuoted();
  HStack_d8.parser_.parser_ = (htmlparser_ctx *)0x1071aa;
  pHStack_98 = pHVar11;
  uStack_90 = uVar13;
  bVar3 = StringToBool((string *)puVar15);
  phVar14 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar3) & 0xffffffff);
  p_Var20 = *(_Base_ptr *)(phVar19 + 0x30);
  HStack_d8.parser_.parser_ = (htmlparser_ctx *)0x1071b5;
  iVar4 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var20);
  if (SUB81(phVar14,0) == (iVar4 != 0)) {
    return;
  }
  HStack_d8.parser_.parser_ = (htmlparser_ctx *)0x1071cb;
  ValidateInJavascript();
  HStack_d8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071da;
  HStack_d8.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar19;
  HStack_d8.parser_.parser_ = phVar14;
  bVar3 = StringToBool((string *)puVar15);
  p_Var21 = p_Var20[1]._M_left;
  HStack_d8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071e5;
  iVar4 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var21);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  HStack_d8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071fb;
  ValidateJavascriptQuoted();
  pHVar11 = (HtmlparserCppTest *)p_Var21[1]._M_left;
  HStack_d8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var20;
  HStack_d8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)this;
  iVar4 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar11);
  puVar16 = kJavascriptStateMap;
  pHVar6 = (HtmlparserCppTest *)IdToName(pHVar11,(IdNameMap *)kJavascriptStateMap,iVar4);
  if (*(long *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    pHVar11 = (HtmlparserCppTest *)&pHStack_e8;
    std::__cxx11::string::string((string *)pHVar11,(char *)pHVar6,&aStack_e9);
    sVar2 = *(size_t *)
             &(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    puVar16 = (undefined1 *)pHVar6;
    if (sVar2 == sStack_e0) {
      if (sVar2 == 0) {
        bVar3 = true;
      }
      else {
        pHVar11 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl;
        puVar16 = (undefined1 *)pHStack_e8;
        iVar4 = bcmp(pHVar11,pHStack_e8,sVar2);
        bVar3 = iVar4 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (pHStack_e8 != &HStack_d8) {
      pHVar11 = pHStack_e8;
      operator_delete(pHStack_e8);
    }
    this = pHStack_e8;
    if (bVar3) {
      return;
    }
  }
  ValidateJavascriptState();
  bVar3 = StringToBool((string *)puVar16);
  pHVar6 = (HtmlparserCppTest *)(pHVar11->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)pHVar6);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateInCss();
  pHVar17 = (HtmlparserCppTest *)&pcStack_130;
  pHVar7 = pHVar6;
  HStack_128.parser_ = (htmlparser_ctx *)pHVar11;
  if (*(long *)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
LAB_00107324:
    pHVar17 = (HtmlparserCppTest *)puVar16;
    p_Stack_138 = (_Base_ptr)0x107329;
    ValidateLine();
  }
  else {
    p_Stack_138 = (_Base_ptr)0x1072dc;
    pcStack_130 = extraout_RAX;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar7 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl;
    p_Stack_138 = (_Base_ptr)0x1072f8;
    this = (HtmlparserCppTest *)strtol((char *)pHVar7,&pcStack_130,10);
    pHVar11 = pHVar6;
    puVar16 = (undefined1 *)pHVar17;
    unaff_R12 = (_Base_ptr)&pcStack_130;
    if ((*pcStack_130 != '\0') ||
       (unaff_R12 = (_Base_ptr)&pcStack_130, unaff_R15->_M_color != _S_red)) goto LAB_00107324;
    pHVar7 = (HtmlparserCppTest *)(pHVar6->parser_).parser_;
    p_Stack_138 = (_Base_ptr)0x107313;
    iVar4 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)pHVar7);
    unaff_R12 = (_Base_ptr)&pcStack_130;
    if (iVar4 == (int)this) {
      return;
    }
  }
  p_Stack_138 = (_Base_ptr)ValidateColumn;
  ValidateLine();
  p_Stack_138 = unaff_R15;
  pHStack_140 = this;
  p_Stack_148 = unaff_R12;
  auStack_158._8_8_ = pHVar11;
  pHVar18 = (HtmlparserCppTest *)auStack_158;
  auStack_158._0_8_ = extraout_RAX_00;
  pHVar6 = pHVar7;
  if (*(long *)&(pHVar17->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
LAB_00107390:
    pHVar18 = pHVar17;
    p_Stack_160 = (_Base_ptr)0x107395;
    ValidateColumn();
  }
  else {
    p_Stack_160 = (_Base_ptr)0x107348;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar6 = *(HtmlparserCppTest **)&(pHVar17->contextMap)._M_t._M_impl;
    p_Stack_160 = (_Base_ptr)0x107364;
    this = (HtmlparserCppTest *)strtol((char *)pHVar6,(char **)auStack_158,10);
    pHVar11 = pHVar7;
    pHVar17 = pHVar18;
    unaff_R12 = (_Base_ptr)auStack_158;
    if ((*(char *)auStack_158._0_8_ != '\0') ||
       (unaff_R12 = (_Base_ptr)auStack_158, unaff_R15->_M_color != _S_red)) goto LAB_00107390;
    pHVar6 = (HtmlparserCppTest *)(pHVar7->parser_).parser_;
    p_Stack_160 = (_Base_ptr)0x10737f;
    iVar4 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)pHVar6);
    unaff_R12 = (_Base_ptr)auStack_158;
    if (iVar4 == (int)this) {
      return;
    }
  }
  p_Stack_160 = (_Base_ptr)ValidateValueIndex;
  ValidateColumn();
  p_Stack_160 = unaff_R15;
  pHStack_168 = this;
  p_Stack_170 = unaff_R12;
  auStack_180._8_8_ = pHVar11;
  pHVar7 = (HtmlparserCppTest *)auStack_180;
  auStack_180._0_8_ = extraout_RAX_01;
  pHVar11 = pHVar6;
  if (*(long *)&(pHVar18->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
    piVar8 = __errno_location();
    *piVar8 = 0;
    pHVar11 = *(HtmlparserCppTest **)&(pHVar18->contextMap)._M_t._M_impl;
    lVar5 = strtol((char *)pHVar11,(char **)auStack_180,10);
    pHVar18 = pHVar7;
    unaff_R12 = (_Base_ptr)auStack_180;
    if ((*(char *)auStack_180._0_8_ == '\0') && (unaff_R12 = (_Base_ptr)auStack_180, *piVar8 == 0))
    {
      pHVar11 = (HtmlparserCppTest *)(pHVar6->parser_).parser_;
      iVar4 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)pHVar11);
      unaff_R12 = (_Base_ptr)auStack_180;
      if (iVar4 == (int)lVar5) {
        return;
      }
      goto LAB_00107401;
    }
  }
  pHVar7 = pHVar18;
  ValidateValueIndex();
LAB_00107401:
  ValidateValueIndex();
  bVar3 = StringToBool((string *)pHVar7);
  pHVar6 = (HtmlparserCppTest *)(pHVar11->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar6);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_1e0.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_1e0.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_1e0.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHStack_1c8 = pHVar11;
  p_Stack_1c0 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)pHVar7,"=",",",&vStack_1e0);
  if (vStack_1e0.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_1e0.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    source = &pHVar6->parser_;
    p_Var1 = &(pHVar6->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_1e0.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar4 = std::__cxx11::string::compare((char *)str_00);
      if (iVar4 == 0) {
        ValidateState(pHVar6,str);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)str_00);
        if (iVar4 == 0) {
          ValidateTag(pHVar6,str);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)str_00);
          if (iVar4 == 0) {
            ValidateAttribute(pHVar6,str);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)str_00);
            if (iVar4 == 0) {
              ValidateValue(pHVar6,str);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)str_00);
              if (iVar4 == 0) {
                ValidateAttributeType(pHVar6,str);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)str_00);
                if (iVar4 == 0) {
                  ValidateAttributeQuoted(pHVar6,str);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar4 == 0) {
                    ValidateInJavascript(pHVar6,str);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar4 == 0) {
                      ValidateJavascriptQuoted(pHVar6,str);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar4 == 0) {
                        ValidateJavascriptState(pHVar6,str);
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar4 == 0) {
                          ValidateInCss(pHVar6,str);
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar4 == 0) {
                            ValidateLine(pHVar6,str);
                          }
                          else {
                            iVar4 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar4 == 0) {
                              ValidateColumn(pHVar6,str);
                            }
                            else {
                              iVar4 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar4 == 0) {
                                ValidateValueIndex(pHVar6,str);
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar4 == 0) {
                                  ValidateIsUrlStart(pHVar6,str);
                                }
                                else {
                                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar4 == 0) {
                                    cVar9 = std::
                                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                            ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar6,str);
                                    if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar10 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar6->contextMap,str);
                                      *ppHVar10 = this_00;
                                    }
                                    ppHVar10 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::operator[](&pHVar6->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar10,source);
                                  }
                                  else {
                                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar4 == 0) {
                                      cVar9 = std::
                                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar6,str);
                                      if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_00107851:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_1e0);
                                        _Unwind_Resume(extraout_RAX_02);
                                      }
                                      ppHVar10 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar6->contextMap,str);
                                      HtmlParser::CopyFrom(source,*ppHVar10);
                                    }
                                    else {
                                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar4 == 0) {
                                        bVar3 = StringToBool(str);
                                        if (bVar3) {
                                          ctemplate_htmlparser::htmlparser_reset(source->parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar4 == 0) {
                                          iVar4 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    (source->parser_,iVar4);
                                        }
                                        else {
                                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar4 != 0) goto LAB_00107851;
                                          bVar3 = StringToBool(str);
                                          if (bVar3) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      (source->parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_1e0.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_1e0);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateValue(const string &expected_value) {
  EXPECT_TRUE(parser_.value() != NULL);
  const string parsed_state(parser_.value());
  EXPECT_EQ(expected_value, parsed_state)
      << "Unexpected value at line " << parser_.line_number();
}